

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.hpp
# Opt level: O1

Vector<double,_7U> * __thiscall
OpenMD::RNEMD::SPFForceManager::linearCombination<OpenMD::Vector<double,7u>>
          (Vector<double,_7U> *__return_storage_ptr__,SPFForceManager *this,
          Vector<double,_7U> *quantityA,Vector<double,_7U> *quantityB)

{
  uint i;
  long lVar1;
  Vector<double,_7U> *result_2;
  double dVar2;
  double dVar3;
  Vector<double,_7U> result;
  Vector<double,_7U> result_1;
  double local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  double local_68 [8];
  
  Snapshot::getSPFData(this->currentSnapshot_);
  dVar2 = pow(*(double *)((long)local_a8 + 0x18),(double)this->k_);
  dVar3 = 1.0;
  if (dVar2 <= 1.0) {
    dVar3 = dVar2;
  }
  dVar3 = (double)(~-(ulong)(dVar2 < 0.0) & (ulong)dVar3);
  if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
  }
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0.0;
  p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78 = 0;
  lVar1 = 0;
  do {
    (&local_a8)[lVar1] = quantityA->data_[lVar1] * (1.0 - dVar3);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  local_68[4] = 0.0;
  local_68[5] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[6] = 0.0;
  lVar1 = 0;
  do {
    local_68[lVar1] = quantityB->data_[lVar1] * dVar3;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  __return_storage_ptr__->data_[4] = 0.0;
  __return_storage_ptr__->data_[5] = 0.0;
  __return_storage_ptr__->data_[2] = 0.0;
  __return_storage_ptr__->data_[3] = 0.0;
  __return_storage_ptr__->data_[0] = 0.0;
  __return_storage_ptr__->data_[1] = 0.0;
  __return_storage_ptr__->data_[6] = 0.0;
  lVar1 = 0;
  do {
    __return_storage_ptr__->data_[lVar1] = (&local_a8)[lVar1] + local_68[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  return __return_storage_ptr__;
}

Assistant:

T linearCombination(T quantityA, T quantityB) {
      RealType result = f_lambda(currentSnapshot_->getSPFData()->lambda);

      return T {(1.0 - result) * quantityA + result * quantityB};
    }